

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::commands::add_commands_from_set(commands *this,command_set *C_set)

{
  command *pcVar1;
  debug *this_00;
  token *__p;
  pointer ptVar2;
  double __x;
  command_node *local_48;
  command_node *cnode;
  token *T;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> local_30;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> Tadd;
  command *cmd;
  command *C_list;
  command_set *C_set_local;
  commands *this_local;
  
  this_00 = debug::initialize(0);
  debug::log(this_00,__x);
  cmd = command_set::get(C_set);
  while (cmd != (command *)0x0) {
    Tadd._M_t.super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t.
    super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
    super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl =
         (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)
         (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)cmd;
    pcVar1 = cmd->next;
    __p = libchars::lexer(&cmd->cmd_str);
    std::unique_ptr<libchars::token,std::default_delete<libchars::token>>::
    unique_ptr<std::default_delete<libchars::token>,void>
              ((unique_ptr<libchars::token,std::default_delete<libchars::token>> *)&local_30,__p);
    ptVar2 = std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::get(&local_30)
    ;
    if (ptVar2 != (pointer)0x0) {
      ptVar2 = std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::get
                         (&local_30);
      local_48 = command_node::add(&this->root,&ptVar2->value,
                                   *(filter_t *)
                                    ((long)Tadd._M_t.
                                           super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                                           .super__Head_base<0UL,_libchars::token_*,_false>.
                                           _M_head_impl + 0x80),
                                   (bool)(*(byte *)((long)Tadd._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                                                  .super__Head_base<0UL,_libchars::token_*,_false>.
                                                  _M_head_impl + 0x88) & 1));
      cnode = (command_node *)ptVar2->next;
      while (cnode != (command_node *)0x0 && local_48 != (command_node *)0x0) {
        local_48 = command_node::add_root
                             (local_48,*(filter_t *)
                                        ((long)Tadd._M_t.
                                               super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                                               .super__Head_base<0UL,_libchars::token_*,_false>.
                                               _M_head_impl + 0x80),
                              (bool)(*(byte *)((long)Tadd._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                                                  .super__Head_base<0UL,_libchars::token_*,_false>.
                                                  _M_head_impl + 0x88) & 1));
        if (local_48 != (command_node *)0x0) {
          local_48 = command_node::add(local_48,&cnode->part,
                                       *(filter_t *)
                                        ((long)Tadd._M_t.
                                               super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                                               .super__Head_base<0UL,_libchars::token_*,_false>.
                                               _M_head_impl + 0x80),
                                       (bool)(*(byte *)((long)Tadd._M_t.
                                                                                                                            
                                                  super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                                                  .super__Head_base<0UL,_libchars::token_*,_false>.
                                                  _M_head_impl + 0x88) & 1));
          cnode = (command_node *)cnode[1].cmd;
        }
      }
      if (local_48 != (command_node *)0x0) {
        this->dirty = true;
        command_node::associate
                  (local_48,(command *)
                            Tadd._M_t.
                            super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                            .super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl);
        std::
        set<libchars::command_*,_libchars::command_sort_criteria,_std::allocator<libchars::command_*>_>
        ::insert(&this->C_sorted,(value_type *)&Tadd);
      }
    }
    std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::~unique_ptr(&local_30);
    cmd = pcVar1;
  }
  return;
}

Assistant:

void commands::add_commands_from_set(command_set &C_set)
    {
        LC_LOG_VERBOSE("set[%p] root[%p]",&C_set,&root);
        command *C_list = C_set.get();
        while (C_list != NULL) {
            command *cmd = C_list;
            C_list = C_list->next;
            // break command string into tokens
            std::unique_ptr<token> Tadd(libchars::lexer(cmd->cmd_str));
            if (Tadd.get() == NULL)
                continue;
            // add command word(s) to dictionary
            token *T = Tadd.get();
            command_node *cnode = root.add(T->value,cmd->mask,cmd->hidden);
            T = T->next;
            while (T != NULL && cnode != NULL) {
                if ((cnode = cnode->add_root(cmd->mask,cmd->hidden)) != NULL) {
                    cnode = cnode->add(T->value,cmd->mask,cmd->hidden);
                    T = T->next;
                }
            }
            // associate dictionary node with command
            if (cnode != NULL) {
                dirty = true;
                cnode->associate(cmd);
                C_sorted.insert(cmd);
            }
        }
    }